

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classloader.cpp
# Opt level: O3

InnerClasses_attribute __thiscall ClassLoader::getAttributeInnerClasses(ClassLoader *this,FILE *fp)

{
  u2 uVar1;
  Class *pCVar2;
  Class CVar3;
  ulong uVar4;
  InnerClasses_attribute IVar5;
  
  uVar1 = readU2(this,fp);
  pCVar2 = (Class *)malloc((ulong)((uint)uVar1 * 8));
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      CVar3 = getClass(this,fp);
      pCVar2[uVar4] = CVar3;
      uVar4 = uVar4 + 1;
    } while (CONCAT62(0,uVar1) != uVar4);
  }
  IVar5.classes = pCVar2;
  IVar5._0_8_ = CONCAT62(0,uVar1);
  return IVar5;
}

Assistant:

InnerClasses_attribute ClassLoader::getAttributeInnerClasses(FILE *fp) {
    InnerClasses_attribute result;
    result.number_of_classes = readU2(fp);
    result.classes = (Class*) malloc(sizeof(Class) * result.number_of_classes);
    for (u2 i = 0; i < result.number_of_classes; i++) {
        result.classes[i] = getClass(fp);
    }
    return result;
}